

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O2

void __thiscall
flatbuffers::vector_downward<unsigned_long>::reallocate
          (vector_downward<unsigned_long> *this,size_t len)

{
  ulong old_size;
  size_t in_use_back;
  uint8_t *puVar1;
  ulong uVar2;
  size_t in_use_front;
  
  old_size = this->reserved_;
  puVar1 = this->buf_;
  if (old_size == 0) {
    uVar2 = this->initial_size_;
  }
  else {
    uVar2 = old_size >> 1;
  }
  in_use_back = this->size_;
  in_use_front = (long)this->scratch_ - (long)puVar1;
  if (len < uVar2) {
    len = uVar2;
  }
  uVar2 = -this->buffer_minalign_ & (len + old_size + this->buffer_minalign_) - 1;
  this->reserved_ = uVar2;
  if (puVar1 == (uint8_t *)0x0) {
    puVar1 = Allocate(this->allocator_,uVar2);
  }
  else {
    puVar1 = ReallocateDownward(this->allocator_,puVar1,old_size,uVar2,in_use_back,in_use_front);
  }
  this->buf_ = puVar1;
  this->cur_ = puVar1 + (this->reserved_ - in_use_back);
  this->scratch_ = puVar1 + in_use_front;
  return;
}

Assistant:

void reallocate(size_t len) {
    auto old_reserved = reserved_;
    auto old_size = size();
    auto old_scratch_size = scratch_size();
    reserved_ +=
        (std::max)(len, old_reserved ? old_reserved / 2 : initial_size_);
    reserved_ = (reserved_ + buffer_minalign_ - 1) & ~(buffer_minalign_ - 1);
    if (buf_) {
      buf_ = ReallocateDownward(allocator_, buf_, old_reserved, reserved_,
                                old_size, old_scratch_size);
    } else {
      buf_ = Allocate(allocator_, reserved_);
    }
    cur_ = buf_ + reserved_ - old_size;
    scratch_ = buf_ + old_scratch_size;
  }